

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

difference_type
QtPrivate::
sequential_erase_if<QList<QTextLayout::FormatRange>,QSyntaxHighlighterPrivate::applyFormatChanges()::__0>
          (QList<QTextLayout::FormatRange> *c,anon_class_8_2_b718747f_for__M_pred *pred)

{
  bool bVar1;
  QList<QTextLayout::FormatRange> *this;
  QList<QTextLayout::FormatRange> *pQVar2;
  difference_type dVar3;
  iterator *this_00;
  FormatRange *range;
  FormatRange *in_RSI;
  QList<QTextLayout::FormatRange> *in_RDI;
  long in_FS_OFFSET;
  difference_type result;
  iterator dest;
  iterator it;
  iterator e;
  const_iterator t_it;
  const_iterator cend;
  const_iterator cbegin;
  FormatRange *in_stack_ffffffffffffff08;
  iterator in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  anon_class_8_2_b718747f_for__M_pred in_stack_ffffffffffffff38;
  const_iterator in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff60;
  iterator abegin;
  const_iterator local_90;
  FormatRange *local_88;
  const_iterator local_80;
  FormatRange *local_78;
  FormatRange *local_70;
  FormatRange *local_68;
  iterator local_60;
  iterator local_58;
  iterator local_50;
  FormatRange *local_48;
  FormatRange *local_40;
  undefined8 local_38;
  FormatRange *local_30;
  FormatRange *local_28;
  FormatRange *local_20;
  FormatRange *local_18;
  FormatRange *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (FormatRange *)QList<QTextLayout::FormatRange>::cbegin(in_stack_ffffffffffffff10.i);
  local_18 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (FormatRange *)QList<QTextLayout::FormatRange>::cend(in_stack_ffffffffffffff10.i);
  local_20 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = local_10;
  local_38._0_4_ = in_RSI->start;
  local_38._4_4_ = in_RSI->length;
  local_18 = local_30;
  local_48 = (FormatRange *)
             std::
             find_if<QList<QTextLayout::FormatRange>::const_iterator,QSyntaxHighlighterPrivate::applyFormatChanges()::__0>
                       (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff38);
  local_40 = local_10;
  local_20 = local_48;
  this = (QList<QTextLayout::FormatRange> *)
         std::distance<QList<QTextLayout::FormatRange>::const_iterator>
                   ((const_iterator)in_stack_ffffffffffffff28.i,
                    (const_iterator)in_stack_ffffffffffffff20.i);
  pQVar2 = (QList<QTextLayout::FormatRange> *)QList<QTextLayout::FormatRange>::size(in_RDI);
  if (this == pQVar2) {
    dVar3 = 0;
  }
  else {
    local_50.i = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QTextLayout::FormatRange>::end(in_stack_ffffffffffffff10.i);
    local_58.i = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QTextLayout::FormatRange>::begin
              ((QList<QTextLayout::FormatRange> *)in_stack_ffffffffffffff10.i);
    local_60 = std::next<QList<QTextLayout::FormatRange>::iterator>
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_58 = local_60;
    while( true ) {
      this_00 = QList<QTextLayout::FormatRange>::iterator::operator++(&local_58);
      local_68 = local_50.i;
      bVar1 = QList<QTextLayout::FormatRange>::iterator::operator!=(this_00,local_50);
      if (!bVar1) break;
      in_stack_ffffffffffffff28.i = in_RSI;
      range = QList<QTextLayout::FormatRange>::iterator::operator*(&local_58);
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/text/qsyntaxhighlighter.cpp:72:37)>
              ::anon_class_8_2_b718747f_for__M_pred::operator()
                        ((anon_class_8_2_b718747f_for__M_pred *)in_stack_ffffffffffffff28.i,range);
      if (!bVar1) {
        in_stack_ffffffffffffff20.i =
             QList<QTextLayout::FormatRange>::iterator::operator*(&local_58);
        QList<QTextLayout::FormatRange>::iterator::operator*(&local_60);
        QTextLayout::FormatRange::operator=(in_stack_ffffffffffffff10.i,in_stack_ffffffffffffff08);
        QList<QTextLayout::FormatRange>::iterator::operator++(&local_60);
      }
    }
    local_70 = local_60.i;
    local_78 = local_50.i;
    dVar3 = std::distance<QList<QTextLayout::FormatRange>::iterator>
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    local_88 = local_60.i;
    QList<QTextLayout::FormatRange>::const_iterator::const_iterator(&local_80,local_60);
    abegin.i = local_50.i;
    QList<QTextLayout::FormatRange>::const_iterator::const_iterator(&local_90,local_50);
    QList<QTextLayout::FormatRange>::erase(this,(const_iterator)abegin.i,in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

auto sequential_erase_if(Container &c, Predicate &pred)
{
    // This is remove_if() modified to perform the find_if step on
    // const_iterators to avoid shared container detaches if nothing needs to
    // be removed. We cannot run remove_if after find_if: doing so would apply
    // the predicate to the first matching element twice!

    const auto cbegin = c.cbegin();
    const auto cend = c.cend();
    const auto t_it = std::find_if(cbegin, cend, pred);
    auto result = std::distance(cbegin, t_it);
    if (result == c.size())
        return result - result; // `0` of the right type

    // now detach:
    const auto e = c.end();

    auto it = std::next(c.begin(), result);
    auto dest = it;

    // Loop Invariants:
    // - it != e
    // - [next(it), e[ still to be checked
    // - [c.begin(), dest[ are result
    while (++it != e) {
        if (!pred(*it)) {
            *dest = std::move(*it);
            ++dest;
        }
    }

    result = std::distance(dest, e);
    c.erase(dest, e);
    return result;
}